

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

void __thiscall dg::vr::GraphBuilder::buildTerminators(GraphBuilder *this,Function *function)

{
  bool bVar1;
  ret_type pBVar2;
  ret_type pSVar3;
  SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock> *in_RDI;
  const_succ_iterator cVar4;
  VRLocation *in_stack_00000030;
  BranchInst *in_stack_00000038;
  GraphBuilder *in_stack_00000040;
  ReturnInst *rturn;
  SwitchInst *swtch;
  BranchInst *branch;
  Instruction *terminator;
  VRLocation *last;
  BasicBlock *block;
  const_iterator __end2;
  const_iterator __begin2;
  Function *__range2;
  iterator_facade_base<llvm::SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock>,_std::random_access_iterator_tag,_const_llvm::BasicBlock,_int,_const_llvm::BasicBlock_*,_const_llvm::BasicBlock_*>
  *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  iterator_facade_base<llvm::SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock>,_std::random_access_iterator_tag,_const_llvm::BasicBlock,_int,_const_llvm::BasicBlock_*,_const_llvm::BasicBlock_*>
  *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  ret_type in_stack_ffffffffffffffa0;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
  local_28;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
  local_20 [4];
  
  local_20[0].NodePtr = (node_pointer)llvm::Function::begin((Function *)in_RDI);
  local_28.NodePtr = (node_pointer)llvm::Function::end((Function *)in_RDI);
  do {
    bVar1 = llvm::operator!=(local_20,&local_28);
    if (!bVar1) {
      return;
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
    ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                 *)0x1bc778);
    std::
    map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
    ::operator[]((map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
                  *)in_stack_ffffffffffffffa0,
                 (key_type *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    llvm::BasicBlock::getTerminator();
    pBVar2 = llvm::dyn_cast<llvm::BranchInst,llvm::Instruction_const>
                       ((Instruction *)in_stack_ffffffffffffff60);
    if (pBVar2 == (ret_type)0x0) {
      pSVar3 = llvm::dyn_cast<llvm::SwitchInst,llvm::Instruction_const>
                         ((Instruction *)in_stack_ffffffffffffff60);
      if (pSVar3 == (ret_type)0x0) {
        in_stack_ffffffffffffffa0 =
             llvm::dyn_cast<llvm::ReturnInst,llvm::Instruction_const>
                       ((Instruction *)in_stack_ffffffffffffff60);
        if (in_stack_ffffffffffffffa0 == (ret_type)0x0) {
          cVar4 = llvm::succ_begin((BasicBlock *)0x1bc840);
          in_stack_ffffffffffffff98 = cVar4.Idx;
          cVar4 = llvm::succ_end((BasicBlock *)0x1bc865);
          in_stack_ffffffffffffff60 =
               (iterator_facade_base<llvm::SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock>,_std::random_access_iterator_tag,_const_llvm::BasicBlock,_int,_const_llvm::BasicBlock_*,_const_llvm::BasicBlock_*>
                *)cVar4.Inst;
          in_stack_ffffffffffffff68 = cVar4.Idx;
          in_stack_ffffffffffffff70 = in_stack_ffffffffffffff60;
          bVar1 = llvm::
                  iterator_facade_base<llvm::SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock>,_std::random_access_iterator_tag,_const_llvm::BasicBlock,_int,_const_llvm::BasicBlock_*,_const_llvm::BasicBlock_*>
                  ::operator!=(in_stack_ffffffffffffff60,in_RDI);
          if (bVar1) {
            abort();
          }
        }
        else {
          buildReturn((ReturnInst *)in_stack_ffffffffffffff70,
                      (VRLocation *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        }
      }
      else {
        buildSwitch(in_stack_00000040,(SwitchInst *)in_stack_00000038,in_stack_00000030);
      }
    }
    else {
      buildBranch(in_stack_00000040,in_stack_00000038,in_stack_00000030);
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
    ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                  *)in_stack_ffffffffffffff60);
  } while( true );
}

Assistant:

void GraphBuilder::buildTerminators(const llvm::Function &function) {
    for (const llvm::BasicBlock &block : function) {
        assert(backs.find(&block) != backs.end());
        VRLocation &last = *backs[&block];

        const llvm::Instruction *terminator = block.getTerminator();
        if (const auto *branch = llvm::dyn_cast<llvm::BranchInst>(terminator)) {
            buildBranch(branch, last);

        } else if (const auto *swtch =
                           llvm::dyn_cast<llvm::SwitchInst>(terminator)) {
            buildSwitch(swtch, last);

        } else if (const auto *rturn =
                           llvm::dyn_cast<llvm::ReturnInst>(terminator)) {
            buildReturn(rturn, last);

        } else if (llvm::succ_begin(&block) != llvm::succ_end(&block)) {
#ifndef NDEBUG
            std::cerr << "Unhandled  terminator: "
                      << dg::debug::getValName(terminator) << "\n";
            llvm::errs() << "Unhandled terminator: " << *terminator << "\n";
#endif
            abort();
        }
    }
}